

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O2

int PackBitsEncode(TIFF *tif,uint8_t *buf,tmsize_t cc,uint16_t s)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  ulong local_40;
  
  puVar3 = tif->tif_rawdata;
  puVar9 = tif->tif_rawcp;
  lVar4 = tif->tif_rawdatasize;
  puVar10 = (uint8_t *)0x0;
  bVar5 = false;
  do {
    uVar11 = 1;
    if (cc < 1) {
      tif->tif_rawcc = (tmsize_t)(puVar9 + (tif->tif_rawcc - (long)tif->tif_rawcp));
      tif->tif_rawcp = puVar9;
      return 1;
    }
    uVar1 = *buf;
    local_40 = cc;
    while (local_40 = local_40 - 1, local_40 != 0) {
      if (uVar1 != buf[uVar11]) goto LAB_00266cf8;
      uVar11 = uVar11 + 1;
    }
    local_40 = 0;
    uVar11 = cc;
LAB_00266cf8:
    buf = buf + uVar11;
    while( true ) {
      if (puVar3 + lVar4 <= puVar9 + 2) {
        if (bVar5) {
          tif->tif_rawcc = (tmsize_t)(puVar10 + (tif->tif_rawcc - (long)tif->tif_rawcp));
          iVar6 = TIFFFlushData1(tif);
          if (iVar6 == 0) {
            return 0;
          }
          puVar8 = tif->tif_rawcp;
          for (lVar7 = (long)puVar9 - (long)puVar10; 0 < lVar7; lVar7 = lVar7 + -1) {
            uVar2 = *puVar10;
            puVar10 = puVar10 + 1;
            *puVar8 = uVar2;
            puVar8 = puVar8 + 1;
          }
          puVar10 = tif->tif_rawcp;
          puVar9 = puVar8;
        }
        else {
          tif->tif_rawcc = (tmsize_t)(puVar9 + (tif->tif_rawcc - (long)tif->tif_rawcp));
          iVar6 = TIFFFlushData1(tif);
          if (iVar6 == 0) {
            return 0;
          }
          puVar9 = tif->tif_rawcp;
        }
      }
      if ((long)uVar11 < 2) {
        *puVar9 = '\0';
        bVar5 = true;
        puVar10 = puVar9;
        goto LAB_00266ecf;
      }
      if (uVar11 < 0x81) break;
      bVar5 = false;
      *puVar9 = 0x81;
      puVar9[1] = uVar1;
      uVar11 = uVar11 - 0x80;
      puVar9 = puVar9 + 2;
    }
    *puVar9 = '\x01' - (char)uVar11;
    bVar5 = false;
LAB_00266ecf:
    puVar8 = puVar9 + 1;
    puVar9 = puVar9 + 2;
    *puVar8 = uVar1;
    cc = local_40;
  } while( true );
}

Assistant:

static int PackBitsEncode(TIFF *tif, uint8_t *buf, tmsize_t cc, uint16_t s)
{
    unsigned char *bp = (unsigned char *)buf;
    uint8_t *op;
    uint8_t *ep;
    uint8_t *lastliteral;
    long n, slop;
    int b;
    enum
    {
        BASE,
        LITERAL,
        RUN,
        LITERAL_RUN
    } state;

    (void)s;
    op = tif->tif_rawcp;
    ep = tif->tif_rawdata + tif->tif_rawdatasize;
    state = BASE;
    lastliteral = 0;
    while (cc > 0)
    {
        /*
         * Find the longest string of identical bytes.
         */
        b = *bp++;
        cc--;
        n = 1;
        for (; cc > 0 && b == *bp; cc--, bp++)
            n++;
    again:
        if (op + 2 >= ep)
        { /* insure space for new data */
            /*
             * Be careful about writing the last
             * literal.  Must write up to that point
             * and then copy the remainder to the
             * front of the buffer.
             */
            if (state == LITERAL || state == LITERAL_RUN)
            {
                slop = (long)(op - lastliteral);
                tif->tif_rawcc += (tmsize_t)(lastliteral - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                while (slop-- > 0)
                    *op++ = *lastliteral++;
                lastliteral = tif->tif_rawcp;
            }
            else
            {
                tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
            }
        }
        switch (state)
        {
            case BASE: /* initial state, set run/literal */
                if (n > 1)
                {
                    state = RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL: /* last object was literal string */
                if (n > 1)
                {
                    state = LITERAL_RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1)); /* encode run */
                    *op++ = (uint8_t)b;
                }
                else
                { /* extend literal */
                    if (++(*lastliteral) == 127)
                        state = BASE;
                    *op++ = (uint8_t)b;
                }
                break;
            case RUN: /* last object was run */
                if (n > 1)
                {
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL_RUN: /* literal followed by a run */
                /*
                 * Check to see if previous run should
                 * be converted to a literal, in which
                 * case we convert literal-run-literal
                 * to a single literal.
                 */
                if (n == 1 && op[-2] == (uint8_t)-1 && *lastliteral < 126)
                {
                    state = (((*lastliteral) += 2) == 127 ? BASE : LITERAL);
                    op[-2] = op[-1]; /* replicate */
                }
                else
                    state = RUN;
                goto again;
        }
    }
    tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
    tif->tif_rawcp = op;
    return (1);
}